

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_wait.cc
# Opt level: O1

uint32_t absl::base_internal::SpinLockWait
                   (atomic<unsigned_int> *w,int n,SpinLockWaitTransition *trans,
                   SchedulingMode scheduling_mode)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  long lVar3;
  byte bVar4;
  SpinLockWaitTransition *pSVar5;
  uint32_t value;
  int iVar6;
  bool bVar7;
  uint32_t local_3c;
  
  iVar6 = 0;
  do {
    value = (w->super___atomic_base<unsigned_int>)._M_i;
    if (n == 0) {
LAB_001526d0:
      iVar6 = iVar6 + 1;
      AbslInternalSpinLockDelay(w,value,iVar6,scheduling_mode);
      bVar4 = 1;
    }
    else {
      if (value == trans->from) {
        lVar3 = 0;
        bVar7 = n == 0;
      }
      else {
        lVar3 = 0;
        pSVar5 = trans + 1;
        do {
          bVar7 = (ulong)(uint)n - 1 == lVar3;
          if (bVar7) goto LAB_001526d0;
          lVar3 = lVar3 + 1;
          puVar2 = &pSVar5->from;
          pSVar5 = pSVar5 + 1;
        } while (value != *puVar2);
      }
      if (bVar7) goto LAB_001526d0;
      if (trans[lVar3].to == value) {
LAB_00152702:
        if (trans[lVar3].done != false) {
          local_3c = value;
        }
        bVar4 = trans[lVar3].done ^ 1;
      }
      else {
        LOCK();
        uVar1 = (w->super___atomic_base<unsigned_int>)._M_i;
        bVar7 = value == uVar1;
        if (bVar7) {
          (w->super___atomic_base<unsigned_int>)._M_i = trans[lVar3].to;
          uVar1 = value;
        }
        value = uVar1;
        UNLOCK();
        bVar4 = 1;
        if (bVar7) goto LAB_00152702;
      }
    }
    if (bVar4 == 0) {
      return local_3c;
    }
  } while( true );
}

Assistant:

uint32_t SpinLockWait(std::atomic<uint32_t> *w, int n,
                      const SpinLockWaitTransition trans[],
                      base_internal::SchedulingMode scheduling_mode) {
  int loop = 0;
  for (;;) {
    uint32_t v = w->load(std::memory_order_acquire);
    int i;
    for (i = 0; i != n && v != trans[i].from; i++) {
    }
    if (i == n) {
      SpinLockDelay(w, v, ++loop, scheduling_mode);  // no matching transition
    } else if (trans[i].to == v ||                   // null transition
               w->compare_exchange_strong(v, trans[i].to,
                                          std::memory_order_acquire,
                                          std::memory_order_relaxed)) {
      if (trans[i].done) return v;
    }
  }
}